

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall perfetto::protos::pbzero::Trigger::set_producer_name(Trigger *this,string *value)

{
  string *value_local;
  Trigger *this_local;
  
  protozero::internal::FieldWriter<(protozero::proto_utils::ProtoSchemaType)9>::Append
            (&this->super_Message,2,(string *)value);
  return;
}

Assistant:

void set_producer_name(std::string value) {
    static constexpr uint32_t field_id = FieldMetadata_ProducerName::kFieldId;
    // Call the appropriate protozero::Message::Append(field_id, ...)
    // method based on the type of the field.
    ::protozero::internal::FieldWriter<
      ::protozero::proto_utils::ProtoSchemaType::kString>
        ::Append(*this, field_id, value);
  }